

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O1

void helper_rfid(CPUPPCState_conflict2 *env)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  CPUPPCState_conflict2 *__mptr;
  
  uVar1 = env->spr[0x1b];
  cpu = &env[-1].spr_cb[0x1bf].oea_write;
  bVar2 = (int)uVar1 < 0;
  if (env->mmu_model != POWERPC_MMU_BOOKE206) {
    bVar2 = (long)uVar1 < 0;
  }
  uVar3 = env->spr[0x1a] & 0xffffffff;
  if (bVar2) {
    uVar3 = env->spr[0x1a];
  }
  env->nip = uVar3 & 0xfffffffffffffffc;
  hreg_store_msr(env,uVar1 & 0xfffffffffffbffff,1);
  (*cpu_interrupt_handler)((CPUState *)cpu,4);
  env->reserve_addr = 0xffffffffffffffff;
  if ((env->tlb_need_flush & 1) == 0) {
    return;
  }
  env->tlb_need_flush = env->tlb_need_flush & 0xfffffffe;
  tlb_flush_ppc64((CPUState *)cpu);
  return;
}

Assistant:

void helper_rfid(CPUPPCState *env)
{
    /*
     * The architeture defines a number of rules for which bits can
     * change but in practice, we handle this in hreg_store_msr()
     * which will be called by do_rfi(), so there is no need to filter
     * here
     */
    do_rfi(env, env->spr[SPR_SRR0], env->spr[SPR_SRR1]);
}